

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O3

void Assimp::GetImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out)

{
  pointer *ppuVar1;
  _Base_ptr *pp_Var2;
  size_t *psVar3;
  OpenGEXImporter *pOVar4;
  OpenGEXImporter *local_28;
  
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::reserve(out,0x40);
  pOVar4 = (OpenGEXImporter *)operator_new(0x90);
  XFileImporter::XFileImporter((XFileImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xb8);
  ObjFileImporter::ObjFileImporter((ObjFileImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xf0);
  BaseImporter::BaseImporter((BaseImporter *)pOVar4);
  (pOVar4->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0080e2b8;
  pOVar4->m_root = (ChildInfo *)0x0;
  *(NodeChildMap **)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header =
       &pOVar4->m_nodeChildMap;
  *(NodeChildMap **)&(pOVar4->m_nodeChildMap)._M_t._M_impl = &pOVar4->m_nodeChildMap;
  *(_Base_ptr *)((long)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       (_Base_ptr)0x0;
  *(vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
    **)((long)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       &pOVar4->m_meshCache;
  (pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)
   &(pOVar4->m_meshCache).
    super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  ppuVar1 = &(pOVar4->m_meshCache).
             super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(pointer **)&(pOVar4->m_mesh2refMap)._M_t._M_impl = ppuVar1;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppuVar1;
  *(undefined8 *)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  pp_Var2 = (_Base_ptr *)
            ((long)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  *(_Base_ptr **)
   ((long)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = pp_Var2;
  *(_Base_ptr **)((long)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       pp_Var2;
  *(_Base_ptr *)((long)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18)
       = (_Base_ptr)0x0;
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xd8);
  Discreet3DSImporter::Discreet3DSImporter((Discreet3DSImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  M3DImporter::M3DImporter((M3DImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x150);
  MD3Importer::MD3Importer((MD3Importer *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x98);
  MD2Importer::MD2Importer((MD2Importer *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x90);
  PLYImporter::PLYImporter((PLYImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xd0);
  MDLImporter::MDLImporter((MDLImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x98);
  ASEImporter::ASEImporter((ASEImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xd0);
  HMPImporter::HMPImporter((HMPImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x110);
  SMDImporter::SMDImporter((SMDImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x98);
  MDCImporter::MDCImporter((MDCImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(200);
  MD5Importer::MD5Importer((MD5Importer *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xa0);
  STLImporter::STLImporter((STLImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x120);
  LWOImporter::LWOImporter((LWOImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  DXFImporter::DXFImporter((DXFImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  NFFImporter::NFFImporter((NFFImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  RAWImporter::RAWImporter((RAWImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  SIBImporter::SIBImporter((SIBImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  OFFImporter::OFFImporter((OFFImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xa0);
  AC3DImporter::AC3DImporter((AC3DImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xe8);
  BVHLoader::BVHLoader((BVHLoader *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  IRRMeshImporter::IRRMeshImporter((IRRMeshImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x90);
  IRRImporter::IRRImporter((IRRImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  Q3DImporter::Q3DImporter((Q3DImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x168);
  memset(pOVar4,0,0x168);
  BaseImporter::BaseImporter((BaseImporter *)pOVar4);
  (pOVar4->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0080ea70;
  *(undefined8 *)&(pOVar4->m_nodeChildMap)._M_t._M_impl = 0;
  *(undefined8 *)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)((long)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       (_Base_ptr)0x0;
  (pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(pOVar4->m_mesh2refMap)._M_t._M_impl = 0;
  *(undefined8 *)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)((long)&(pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  (pOVar4->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pOVar4->m_material2refMap)._M_t._M_impl = 0;
  *(undefined8 *)&(pOVar4->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)
   ((long)&(pOVar4->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       (_Base_ptr)0x0;
  (pOVar4->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar4->m_ctx = (Context *)0x0;
  pOVar4->m_metrics[0].m_stringValue._M_dataplus._M_p = (pointer)0x0;
  pOVar4->m_metrics[0].m_stringValue._M_string_length = 0;
  pOVar4->m_metrics[0].m_stringValue.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pOVar4->m_metrics[0].m_stringValue.field_2 + 8) = 0;
  pOVar4->m_metrics[0].m_floatValue = 0.0;
  pOVar4->m_metrics[0].m_intValue = 0;
  pOVar4->m_metrics[1].m_stringValue._M_dataplus._M_p = (pointer)0x0;
  pOVar4->m_metrics[1].m_stringValue._M_string_length = 0;
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x1a8);
  ColladaLoader::ColladaLoader((ColladaLoader *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  TerragenImporter::TerragenImporter((TerragenImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  CSMImporter::CSMImporter((CSMImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  UnrealImporter::UnrealImporter((UnrealImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xa8);
  LWSImporter::LWSImporter((LWSImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xd0);
  memset(pOVar4,0,0xd0);
  BaseImporter::BaseImporter((BaseImporter *)pOVar4);
  (pOVar4->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0080fdd8;
  pOVar4->m_root = (ChildInfo *)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(pOVar4->m_nodeChildMap)._M_t._M_impl = 0;
  *(undefined1 *)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  psVar3 = &(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)&(pOVar4->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)psVar3;
  (pOVar4->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar3;
  *(undefined8 *)&(pOVar4->m_mesh2refMap)._M_t._M_impl = 0;
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x338);
  OpenGEX::OpenGEXImporter::OpenGEXImporter(pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  MS3DImporter::MS3DImporter((MS3DImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  COBImporter::COBImporter((COBImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  BlenderImporter::BlenderImporter((BlenderImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xd0);
  Q3BSPFileImporter::Q3BSPFileImporter((Q3BSPFileImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  NDOImporter::NDOImporter((NDOImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x88);
  IFCImporter::IFCImporter((IFCImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x90);
  XGLImporter::XGLImporter((XGLImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x88);
  FBXImporter::FBXImporter((FBXImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x80);
  (pOVar4->super_BaseImporter)._vptr_BaseImporter = (_func_int **)0x0;
  *(undefined8 *)&(pOVar4->super_BaseImporter).importerUnits._M_t._M_impl = 0;
  *(undefined8 *)
   &(pOVar4->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)
   ((long)&(pOVar4->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pOVar4->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = (_Base_ptr)0x0;
  (pOVar4->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pOVar4->super_BaseImporter).applicationUnits = 0;
  (pOVar4->super_BaseImporter).importerScale = 0.0;
  (pOVar4->super_BaseImporter).fileScale = 0.0;
  (pOVar4->super_BaseImporter).m_ErrorText._M_dataplus._M_p = (pointer)0x0;
  (pOVar4->super_BaseImporter).m_ErrorText._M_string_length = 0;
  (pOVar4->super_BaseImporter).m_ErrorText.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pOVar4->super_BaseImporter).m_ErrorText.field_2 + 8) = 0;
  (pOVar4->super_BaseImporter).m_progress = (ProgressHandler *)0x0;
  pOVar4->m_root = (ChildInfo *)0x0;
  BaseImporter::BaseImporter((BaseImporter *)pOVar4);
  (pOVar4->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0080e9f0;
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xb0);
  glTFImporter::glTFImporter((glTFImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xb0);
  glTF2Importer::glTF2Importer((glTF2Importer *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  D3MFImporter::D3MFImporter((D3MFImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xa8);
  X3DImporter::X3DImporter((X3DImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0xb0);
  MMDImporter::MMDImporter((MMDImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  pOVar4 = (OpenGEXImporter *)operator_new(0x78);
  StepFile::StepFileImporter::StepFileImporter((StepFileImporter *)pOVar4);
  local_28 = pOVar4;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_28);
  return;
}

Assistant:

void GetImporterInstanceList(std::vector< BaseImporter* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each worker class here
    // (register_new_importers_here)
    // ----------------------------------------------------------------------------
    out.reserve(64);
#if (!defined ASSIMP_BUILD_NO_X_IMPORTER)
    out.push_back( new XFileImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OBJ_IMPORTER)
    out.push_back( new ObjFileImporter());
#endif
#ifndef ASSIMP_BUILD_NO_AMF_IMPORTER
	out.push_back( new AMFImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_3DS_IMPORTER)
    out.push_back( new Discreet3DSImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_M3D_IMPORTER)
    out.push_back( new M3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MD3_IMPORTER)
    out.push_back( new MD3Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_MD2_IMPORTER)
    out.push_back( new MD2Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_PLY_IMPORTER)
    out.push_back( new PLYImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MDL_IMPORTER)
    out.push_back( new MDLImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_ASE_IMPORTER)
  #if (!defined ASSIMP_BUILD_NO_3DS_IMPORTER)
    out.push_back( new ASEImporter());
#  endif
#endif
#if (!defined ASSIMP_BUILD_NO_HMP_IMPORTER)
    out.push_back( new HMPImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_SMD_IMPORTER)
    out.push_back( new SMDImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MDC_IMPORTER)
    out.push_back( new MDCImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MD5_IMPORTER)
    out.push_back( new MD5Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_STL_IMPORTER)
    out.push_back( new STLImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_LWO_IMPORTER)
    out.push_back( new LWOImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_DXF_IMPORTER)
    out.push_back( new DXFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_NFF_IMPORTER)
    out.push_back( new NFFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_RAW_IMPORTER)
    out.push_back( new RAWImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_SIB_IMPORTER)
    out.push_back( new SIBImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OFF_IMPORTER)
    out.push_back( new OFFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_AC_IMPORTER)
    out.push_back( new AC3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_BVH_IMPORTER)
    out.push_back( new BVHLoader());
#endif
#if (!defined ASSIMP_BUILD_NO_IRRMESH_IMPORTER)
    out.push_back( new IRRMeshImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_IRR_IMPORTER)
    out.push_back( new IRRImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_Q3D_IMPORTER)
    out.push_back( new Q3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_B3D_IMPORTER)
    out.push_back( new B3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_COLLADA_IMPORTER)
    out.push_back( new ColladaLoader());
#endif
#if (!defined ASSIMP_BUILD_NO_TERRAGEN_IMPORTER)
    out.push_back( new TerragenImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_CSM_IMPORTER)
    out.push_back( new CSMImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_3D_IMPORTER)
    out.push_back( new UnrealImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_LWS_IMPORTER)
    out.push_back( new LWSImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OGRE_IMPORTER)
    out.push_back( new Ogre::OgreImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OPENGEX_IMPORTER )
    out.push_back( new OpenGEX::OpenGEXImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_MS3D_IMPORTER)
    out.push_back( new MS3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_COB_IMPORTER)
    out.push_back( new COBImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_BLEND_IMPORTER)
    out.push_back( new BlenderImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_Q3BSP_IMPORTER)
    out.push_back( new Q3BSPFileImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_NDO_IMPORTER)
    out.push_back( new NDOImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_IFC_IMPORTER)
    out.push_back( new IFCImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_XGL_IMPORTER )
    out.push_back( new XGLImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_FBX_IMPORTER )
    out.push_back( new FBXImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_ASSBIN_IMPORTER )
    out.push_back( new AssbinImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_GLTF_IMPORTER )
    out.push_back( new glTFImporter() );
    out.push_back( new glTF2Importer() );
#endif
#if ( !defined ASSIMP_BUILD_NO_C4D_IMPORTER )
    out.push_back( new C4DImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_3MF_IMPORTER )
    out.push_back( new D3MFImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_X3D_IMPORTER
    out.push_back( new X3DImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_MMD_IMPORTER
    out.push_back( new MMDImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_STEP_IMPORTER
    out.push_back(new StepFile::StepFileImporter());
#endif
}